

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

ostream * Imath_2_5::operator<<(ostream *s,Matrix33<float> *m)

{
  fmtflags __fmtfl;
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  _Setw _Var2;
  streamsize sVar3;
  ostream *poVar4;
  float *pfVar5;
  Matrix33<float> *in_RSI;
  ostream *in_RDI;
  int width;
  fmtflags oldFlags;
  fmtflags in_stack_ffffffffffffff2c;
  ios_base *in_stack_ffffffffffffff30;
  int local_18;
  
  __fmtfl = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  __a = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  _Var1 = std::operator&(__a,_S_fixed);
  if (_Var1 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    std::ios_base::setf(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    std::ios_base::setf(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    sVar3 = std::ios_base::precision((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    local_18 = (int)sVar3 + 8;
  }
  else {
    std::ios_base::setf(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    sVar3 = std::ios_base::precision((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    local_18 = (int)sVar3 + 5;
  }
  poVar4 = std::operator<<(in_RDI,"(");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pfVar5);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pfVar5[1]);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pfVar5[2]);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pfVar5);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pfVar5[1]);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pfVar5[2]);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pfVar5);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pfVar5[1]);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(local_18);
  poVar4 = std::operator<<(poVar4,_Var2);
  pfVar5 = Matrix33<float>::operator[](in_RSI,2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pfVar5[2]);
  std::operator<<(poVar4,")\n");
  std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::ostream &
operator << (std::ostream &s, const Matrix33<T> &m)
{
    std::ios_base::fmtflags oldFlags = s.flags();
    int width;

    if (s.flags() & std::ios_base::fixed)
    {
        s.setf (std::ios_base::showpoint);
        width = static_cast<int>(s.precision()) + 5;
    }
    else
    {
        s.setf (std::ios_base::scientific);
        s.setf (std::ios_base::showpoint);
        width = static_cast<int>(s.precision()) + 8;
    }

    s << "(" << std::setw (width) << m[0][0] <<
         " " << std::setw (width) << m[0][1] <<
         " " << std::setw (width) << m[0][2] << "\n" <<

         " " << std::setw (width) << m[1][0] <<
         " " << std::setw (width) << m[1][1] <<
         " " << std::setw (width) << m[1][2] << "\n" <<

         " " << std::setw (width) << m[2][0] <<
         " " << std::setw (width) << m[2][1] <<
         " " << std::setw (width) << m[2][2] << ")\n";

    s.flags (oldFlags);
    return s;
}